

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

void MpiDisconnectWriterPerReader(CP_Services Svcs,DP_WSR_Stream WSR_Stream_v)

{
  int iVar1;
  int *in_RSI;
  undefined8 *in_RDI;
  int i;
  int CohortSize;
  MpiStreamWR StreamWR;
  MpiStreamWPR StreamWPR;
  int local_28;
  
  iVar1 = *in_RSI;
  (*(code *)*in_RDI)(**(undefined8 **)(in_RSI + 6),5,
                     "MpiDisconnectWriterPerReader invoked [rank:%d;cohortSize:%d]\n",iVar1,
                     *(undefined4 *)(*(undefined8 **)(in_RSI + 6) + 1));
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    if (*(undefined **)(*(long *)(in_RSI + 0x1e) + (long)local_28 * 8) != &ompi_mpi_comm_null) {
      MPI_Comm_disconnect(*(long *)(in_RSI + 0x1e) + (long)local_28 * 8);
    }
  }
  return;
}

Assistant:

static void MpiDisconnectWriterPerReader(CP_Services Svcs, DP_WSR_Stream WSR_Stream_v)
{
    MpiStreamWPR StreamWPR = (MpiStreamWPR)WSR_Stream_v;
    MpiStreamWR StreamWR = StreamWPR->StreamWR;

    const int CohortSize = StreamWPR->Link.CohortSize;

    Svcs->verbose(StreamWR->Stream.CP_Stream, DPTraceVerbose,
                  "MpiDisconnectWriterPerReader invoked [rank:%d;cohortSize:%d]\n", CohortSize,
                  StreamWR->Stream.Rank);

    for (int i = 0; i < CohortSize; i++)
    {
        if (StreamWPR->CohortMpiComms[i] != MPI_COMM_NULL)
        {
            MPI_Comm_disconnect(&StreamWPR->CohortMpiComms[i]);
        }
    }
}